

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void __thiscall
ac::core::Image::create(Image *this,int w,int h,int c,ElementType elementType,int stride)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ImageData *pIVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  int size;
  undefined1 local_2d;
  int local_2c;
  ImageData *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  iVar3 = (elementType & 0xffU) * c * w;
  if (0 < stride) {
    iVar3 = stride;
  }
  local_2c = iVar3 * h;
  if (0 < local_2c) {
    this->w = w;
    this->h = h;
    this->c = c;
    this->elementType = elementType;
    this->pitch = iVar3;
    local_28 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<ac::core::Image::ImageData,std::allocator<ac::core::Image::ImageData>,int&>
              (a_Stack_20,&local_28,(allocator<ac::core::Image::ImageData> *)&local_2d,&local_2c);
    _Var2._M_pi = a_Stack_20[0]._M_pi;
    pIVar1 = local_28;
    local_28 = (ImageData *)0x0;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->dptr).
              super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    (this->dptr).super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pIVar1;
    (this->dptr).super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
      }
    }
    this->pixels = ((this->dptr).
                    super___shared_ptr<ac::core::Image::ImageData,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->data;
  }
  return;
}

Assistant:

void ac::core::Image::create(const int w, const int h, const int c, const ElementType elementType, const int stride)
{
    int pitch = stride > 0 ? stride : w * c * (elementType & 0xff);
    int size = h * pitch;
    if (!(size > 0)) return;
    this->w = w;
    this->h = h;
    this->c = c;
    this->elementType = elementType;
    this->pitch = pitch;
    this->dptr = std::make_shared<ImageData>(size);
    this->pixels = this->dptr->data;
}